

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O0

QStringList * QUrl::idnWhitelist(void)

{
  long lVar1;
  int iVar2;
  anon_class_1_0_00000001 *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffffb8;
  QList<QString> *in_stack_ffffffffffffffc0;
  anon_class_1_0_00000001 *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (user_idn_whitelist == (QStringList *)0x0) {
    if (idnWhitelist()::list == '\0') {
      this = in_RDI;
      iVar2 = __cxa_guard_acquire(&idnWhitelist()::list);
      if (iVar2 != 0) {
        idnWhitelist::anon_class_1_0_00000001::operator()(this);
        __cxa_atexit(QList<QString>::~QList,&idnWhitelist::list,&__dso_handle);
        __cxa_guard_release(&idnWhitelist()::list);
      }
    }
    QList<QString>::QList(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    QList<QString>::QList(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QStringList *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QUrl::idnWhitelist()
{
    if (user_idn_whitelist)
        return *user_idn_whitelist;
    static const QStringList list = [] {
        QStringList list;
        list.reserve(idn_whitelist.count());
        int i = 0;
        while (i < idn_whitelist.count()) {
            list << QLatin1StringView(idn_whitelist.at(i));
            ++i;
        }
        return list;
    }();
    return list;
}